

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

DiagnosticSeverity __thiscall
slang::DiagnosticEngine::getSeverity(DiagnosticEngine *this,DiagCode code,SourceLocation location)

{
  bool bVar1;
  uint n_;
  DiagCode code_00;
  DiagnosticSeverity *pDVar2;
  long lVar3;
  size_t sVar4;
  group_type *pgVar5;
  value_type *pvVar6;
  pointer ppVar7;
  long in_RDI;
  iterator iVar8;
  const_iterator cVar9;
  DiagnosticSeverity result;
  const_iterator it;
  optional<slang::DiagnosticSeverity> sev;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_fffffffffffffe68;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
  *in_stack_fffffffffffffe70;
  DiagCode *in_stack_fffffffffffffe78;
  equal_to<slang::DiagCode> *this_00;
  equal_to<slang::DiagCode> local_108 [4];
  DiagnosticSeverity local_104;
  equal_to<slang::DiagCode> *local_100;
  long local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  equal_to<slang::DiagCode> *local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
  local_b0;
  DiagnosticEngine *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  undefined1 local_88 [16];
  table_element_pointer ppStack_80;
  uint local_44;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  equal_to<slang::DiagCode> *local_10;
  long local_8;
  
  findMappedSeverity(in_stack_ffffffffffffff68,local_88._4_4_,in_stack_ffffffffffffff70);
  bVar1 = std::optional<slang::DiagnosticSeverity>::has_value
                    ((optional<slang::DiagnosticSeverity> *)0x633280);
  if (bVar1) {
    pDVar2 = std::optional<slang::DiagnosticSeverity>::operator*
                       ((optional<slang::DiagnosticSeverity> *)0x633290);
    local_104 = *pDVar2;
  }
  else {
    lVar3 = in_RDI + 0x20;
    local_100 = local_108;
    local_f8 = lVar3;
    local_d0 = local_108;
    local_c8 = lVar3;
    sVar4 = boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            ::hash_for<slang::DiagCode>
                      (in_stack_fffffffffffffe70,(DiagCode *)in_stack_fffffffffffffe68);
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
               ::position_for(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    local_20 = sVar4;
    local_10 = local_108;
    local_8 = lVar3;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      sVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      pgVar5 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
               ::groups((table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                         *)0x6333d6);
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
      if (local_44 != 0) {
        pvVar6 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                 ::elements((table_arrays<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                             *)0x633421);
        do {
          n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffe78 =
               (DiagCode *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                       *)0x633471);
          this_00 = local_10;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,slang::DiagnosticSeverity>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>
          ::key_from<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>
                    ((pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *)0x63349e);
          bVar1 = std::equal_to<slang::DiagCode>::operator()
                            (this_00,in_stack_fffffffffffffe78,(DiagCode *)in_stack_fffffffffffffe70
                            );
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
            ::table_locator(&local_b0,pgVar5 + sVar4,n_,pvVar6 + sVar4 * 0xf + (ulong)n_);
            goto LAB_00633592;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      if (bVar1) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
        ::table_locator(&local_b0);
        goto LAB_00633592;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(in_RDI + 0x28));
    } while (bVar1);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>
    ::table_locator(&local_b0);
LAB_00633592:
    iVar8 = boost::unordered::detail::foa::
            table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            ::make_iterator((locator *)0x63359f);
    local_e0.pc_ = iVar8.pc_;
    ppStack_80 = iVar8.p_;
    local_e0.p_ = ppStack_80;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = local_c0.pc_;
    local_e8 = local_c0.p_;
    cVar9 = boost::unordered::
            unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            ::end((unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                   *)0x63362c);
    code_00 = cVar9.pc_._0_4_;
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (bVar1) {
      ppVar7 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_fffffffffffffe70);
      local_104 = ppVar7->second;
    }
    else {
      local_104 = getDefaultSeverity(code_00);
      switch(local_104) {
      case Ignored:
        break;
      case Note:
        if ((*(byte *)(in_RDI + 0x15) & 1) != 0) {
          local_104 = Ignored;
        }
        break;
      case Warning:
        if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
          if ((*(byte *)(in_RDI + 0x16) & 1) != 0) {
            local_104 = Error;
          }
        }
        else {
          local_104 = Ignored;
        }
        break;
      case Error:
        if ((*(byte *)(in_RDI + 0x17) & 1) != 0) {
          local_104 = Fatal;
        }
        break;
      case Fatal:
        if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
          local_104 = Error;
        }
      }
    }
  }
  return local_104;
}

Assistant:

DiagnosticSeverity DiagnosticEngine::getSeverity(DiagCode code, SourceLocation location) const {
    // Check if we have an in-source severity configured.
    if (auto sev = findMappedSeverity(code, location); sev.has_value())
        return *sev;

    if (auto it = severityTable.find(code); it != severityTable.end())
        return it->second;

    auto result = getDefaultSeverity(code);
    switch (result) {
        case DiagnosticSeverity::Ignored:
            break;
        case DiagnosticSeverity::Note:
            if (ignoreAllNotes)
                return DiagnosticSeverity::Ignored;
            break;
        case DiagnosticSeverity::Warning:
            if (ignoreAllWarnings)
                return DiagnosticSeverity::Ignored;
            if (warningsAsErrors)
                return DiagnosticSeverity::Error;
            break;
        case DiagnosticSeverity::Error:
            if (errorsAsFatal)
                return DiagnosticSeverity::Fatal;
            break;
        case DiagnosticSeverity::Fatal:
            if (fatalsAsErrors)
                return DiagnosticSeverity::Error;
            break;
    }
    return result;
}